

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermNode * __thiscall
glslang::TParseContext::executeInitializer
          (TParseContext *this,TSourceLoc *loc,TIntermTyped *initializer,TVariable *variable)

{
  TIntermediate *this_00;
  TIntermTyped *this_01;
  bool bVar1;
  int iVar2;
  TOperator TVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *this_02;
  size_type sVar6;
  undefined4 extraout_var_02;
  long lVar7;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar8;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TQualifier *pTVar9;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  TIntermTyped *pTVar10;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  TArraySizes *pTVar11;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  TArraySizes *this_03;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  char *pcVar12;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  TConstUnionArray *pTVar13;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  bool bVar14;
  bool local_2e9;
  TString local_260;
  TString local_238;
  TParseContext *local_210;
  TIntermTyped *initNode;
  TIntermSymbol *intermSymbol;
  char *initFeature_1;
  char *initFeature;
  TString local_1e8;
  pool_allocator<char> local_1c0;
  TString local_1b8;
  TString local_190;
  pool_allocator<char> local_168;
  TString local_160;
  pool_allocator<char> local_138;
  TString local_130;
  TString local_108;
  int local_e0;
  undefined4 local_dc;
  int d;
  TType skeletalType;
  char *feature;
  TStorageQualifier qualifier;
  bool nullInit;
  TVariable *variable_local;
  TIntermTyped *initializer_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  iVar2 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])();
  bVar14 = false;
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])();
    TVar3 = TIntermOperator::getOp((TIntermOperator *)CONCAT44(extraout_var_00,iVar2));
    bVar14 = false;
    if (TVar3 == EOpNull) {
      iVar2 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])();
      this_02 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 400))();
      sVar6 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(this_02);
      bVar14 = sVar6 == 0;
    }
  }
  iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
  lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x58))();
  feature._0_4_ = (uint)*(ulong *)(lVar7 + 8) & 0x7f;
  if (((((*(ulong *)(lVar7 + 8) & 0x7f) != 0) && ((uint)feature != 1)) && ((uint)feature != 2)) &&
     ((((uint)feature != 5 || (bVar1 = TParseVersions::isEsProfile((TParseVersions *)this), bVar1))
      || ((this->super_TParseContextBase).super_TParseVersions.version < 0x78)))) {
    if ((uint)feature != 7) {
      iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
      pcVar12 = TType::getStorageQualifierString((TType *)CONCAT44(extraout_var_03,iVar2));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc," cannot initialize this type of qualifier ",pcVar12,"");
      return (TIntermNode *)0x0;
    }
    if (bVar14) {
      skeletalType.spirvType = (TSpirvType *)anon_var_dwarf_ca516b;
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,8,0,"GL_EXT_null_initializer",
                 "initialization with shared qualifier");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,-9,0,"GL_EXT_null_initializer",
                 (char *)skeletalType.spirvType);
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"initializer can only be a null initializer (\'{}\')","shared","");
    }
  }
  if (bVar14) {
    iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
    uVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x1a8))();
    if ((uVar8 & 1) != 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"null initializers can\'t size unsized arrays","{}","");
      return (TIntermNode *)0x0;
    }
    iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
    uVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar2) + 0x1b0))();
    if ((uVar8 & 1) == 0) {
      iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
      pTVar9 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar2) + 0x50))();
      TQualifier::setNullInit(pTVar9);
      return (TIntermNode *)0x0;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"null initializers can\'t be used on opaque values","{}","");
    return (TIntermNode *)0x0;
  }
  iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
  arrayObjectCheck(this,loc,(TType *)CONCAT44(extraout_var_07,iVar2),"array initializer");
  TType::TType((TType *)&d,EbtVoid,EvqTemporary,1,0,0,false);
  iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
  TType::shallowCopy((TType *)&d,(TType *)CONCAT44(extraout_var_08,iVar2));
  pTVar9 = TType::getQualifier((TType *)&d);
  TQualifier::makeTemporary(pTVar9);
  pTVar10 = convertInitializerList(this,loc,(TType *)&d,initializer);
  if (pTVar10 == (TIntermTyped *)0x0) {
    if ((uint)feature == 2) {
      iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
      pTVar9 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_09,iVar2) + 0x50))();
      TQualifier::makeTemporary(pTVar9);
    }
    this_local = (TParseContext *)0x0;
  }
  else {
    iVar2 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    uVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar2) + 0xf0))();
    if ((uVar8 & 1) != 0) {
      iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
      uVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar2) + 0xf8))();
      if ((uVar8 & 1) != 0) {
        iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
        iVar5 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar5) + 0x78))();
        TType::changeOuterArraySize((TType *)CONCAT44(extraout_var_12,iVar2),iVar5);
      }
    }
    iVar2 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar14 = TType::isArrayOfArrays((TType *)CONCAT44(extraout_var_14,iVar2));
    if (bVar14) {
      iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
      bVar14 = TType::isArrayOfArrays((TType *)CONCAT44(extraout_var_15,iVar2));
      if (bVar14) {
        iVar2 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        pTVar11 = (TArraySizes *)(**(code **)(*(long *)CONCAT44(extraout_var_16,iVar2) + 0x98))();
        iVar2 = TArraySizes::getNumDims(pTVar11);
        iVar5 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
        pTVar11 = (TArraySizes *)(**(code **)(*(long *)CONCAT44(extraout_var_17,iVar5) + 0x98))();
        iVar5 = TArraySizes::getNumDims(pTVar11);
        if (iVar2 == iVar5) {
          local_e0 = 1;
          while( true ) {
            iVar2 = local_e0;
            iVar5 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
            pTVar11 = (TArraySizes *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar5) + 0x98))();
            iVar5 = TArraySizes::getNumDims(pTVar11);
            if (iVar5 <= iVar2) break;
            iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
            pTVar11 = (TArraySizes *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar2) + 0x98))();
            iVar2 = TArraySizes::getDimSize(pTVar11,local_e0);
            if (iVar2 == 0) {
              iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
              pTVar11 = (TArraySizes *)
                        (**(code **)(*(long *)CONCAT44(extraout_var_20,iVar2) + 0xa0))();
              iVar2 = local_e0;
              iVar5 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1e])();
              this_03 = (TArraySizes *)
                        (**(code **)(*(long *)CONCAT44(extraout_var_21,iVar5) + 0x98))();
              iVar5 = TArraySizes::getDimSize(this_03,local_e0);
              TArraySizes::setDimSize(pTVar11,iVar2,iVar5);
            }
            local_e0 = local_e0 + 1;
          }
        }
      }
    }
    if ((uint)feature == 5) {
      iVar2 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      pTVar9 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_22,iVar2) + 0x58))();
      bVar14 = TQualifier::isFrontEndConstant(pTVar9);
      if (!bVar14) {
        iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
        bVar14 = TIntermediate::getEnhancedMsgs
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate);
        pool_allocator<char>::pool_allocator(&local_138);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_130,"",&local_138);
        pool_allocator<char>::pool_allocator(&local_168);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_160,"",&local_168);
        TType::getCompleteString
                  (&local_108,(TType *)CONCAT44(extraout_var_23,iVar2),bVar14,true,true,true,
                   &local_130,&local_160);
        pcVar12 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                            (&local_108);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"uniform initializers must be constant","=","\'%s\'",pcVar12);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_108);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_160);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_130);
        iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
        pTVar9 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_24,iVar2) + 0x50))();
        TQualifier::makeTemporary(pTVar9);
        this_local = (TParseContext *)0x0;
        goto LAB_00773b21;
      }
    }
    if (((uint)feature == 2) &&
       (bVar14 = TSymbolTable::atGlobalLevel((this->super_TParseContextBase).symbolTable), bVar14))
    {
      iVar2 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      pTVar9 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_25,iVar2) + 0x58))();
      bVar14 = TQualifier::isConstant(pTVar9);
      if (!bVar14) {
        iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
        bVar14 = TIntermediate::getEnhancedMsgs
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate);
        pool_allocator<char>::pool_allocator(&local_1c0);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_1b8,"",&local_1c0);
        pool_allocator<char>::pool_allocator((pool_allocator<char> *)&initFeature);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_1e8,"",(pool_allocator<char> *)&initFeature);
        TType::getCompleteString
                  (&local_190,(TType *)CONCAT44(extraout_var_26,iVar2),bVar14,true,true,true,
                   &local_1b8,&local_1e8);
        pcVar12 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                            (&local_190);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"global const initializers must be constant","=","\'%s\'",pcVar12);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_190);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_1e8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_1b8);
        iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
        pTVar9 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_27,iVar2) + 0x50))();
        TQualifier::makeTemporary(pTVar9);
        this_local = (TParseContext *)0x0;
        goto LAB_00773b21;
      }
    }
    if ((uint)feature == 2) {
      iVar2 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      pTVar9 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_28,iVar2) + 0x58))();
      bVar14 = TQualifier::isConstant(pTVar9);
      if (!bVar14) {
        initFeature_1 = "non-constant initializer";
        TParseVersions::requireProfile((TParseVersions *)this,loc,-9,"non-constant initializer");
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,-9,0x1a4,"GL_ARB_shading_language_420pack",
                   initFeature_1);
        iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
        lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_29,iVar2) + 0x50))();
        *(ulong *)(lVar7 + 8) = *(ulong *)(lVar7 + 8) & 0xffffffffffffff80 | 0x13;
        feature._0_4_ = 0x13;
      }
    }
    else {
      bVar14 = TSymbolTable::atGlobalLevel((this->super_TParseContextBase).symbolTable);
      if (bVar14) {
        iVar2 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        pTVar9 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_30,iVar2) + 0x58))();
        bVar14 = TQualifier::isConstant(pTVar9);
        if (!bVar14) {
          intermSymbol = (TIntermSymbol *)anon_var_dwarf_ca51fa;
          bVar14 = TParseVersions::isEsProfile((TParseVersions *)this);
          if (bVar14) {
            bVar14 = TParseVersions::relaxedErrors((TParseVersions *)this);
            if ((bVar14) &&
               (uVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                          [8])(this,"GL_EXT_shader_non_constant_global_initializers"),
               (uVar4 & 1) == 0)) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"not allowed in this version",intermSymbol,"");
            }
            else {
              TParseVersions::profileRequires
                        ((TParseVersions *)this,loc,8,0,
                         "GL_EXT_shader_non_constant_global_initializers",(char *)intermSymbol);
            }
          }
        }
      }
    }
    if (((uint)feature == 2) || ((uint)feature == 5)) {
      this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
      pTVar10 = TIntermediate::addConversion
                          (this_00,EOpAssign,(TType *)CONCAT44(extraout_var_31,iVar2),pTVar10);
      if (pTVar10 != (TIntermTyped *)0x0) {
        iVar2 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        pTVar9 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_32,iVar2) + 0x58))();
        bVar14 = TQualifier::isConstant(pTVar9);
        if (bVar14) {
          iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
          iVar5 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1e])();
          bVar14 = TType::operator!=((TType *)CONCAT44(extraout_var_33,iVar2),
                                     (TType *)CONCAT44(extraout_var_34,iVar5));
          if (!bVar14) {
            iVar2 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[5])();
            local_2e9 = true;
            if (CONCAT44(extraout_var_37,iVar2) == 0) {
              iVar2 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1e])();
              pTVar9 = (TQualifier *)
                       (**(code **)(*(long *)CONCAT44(extraout_var_38,iVar2) + 0x58))();
              local_2e9 = TQualifier::isSpecConstant(pTVar9);
            }
            if (local_2e9 == false) {
              __assert_fail("initializer->getAsConstantUnion() || initializer->getType().getQualifier().isSpecConstant()"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                            ,0x21a2,
                            "TIntermNode *glslang::TParseContext::executeInitializer(const TSourceLoc &, TIntermTyped *, TVariable *)"
                           );
            }
            iVar2 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[5])();
            if (CONCAT44(extraout_var_39,iVar2) == 0) {
              iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
              pTVar9 = (TQualifier *)
                       (**(code **)(*(long *)CONCAT44(extraout_var_41,iVar2) + 0x50))();
              TQualifier::makeSpecConstant(pTVar9);
              (*(variable->super_TSymbol)._vptr_TSymbol[0x1a])(variable,pTVar10);
            }
            else {
              iVar2 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[5])();
              pTVar13 = TIntermConstantUnion::getConstArray
                                  ((TIntermConstantUnion *)CONCAT44(extraout_var_40,iVar2));
              (*(variable->super_TSymbol)._vptr_TSymbol[0x19])(variable,pTVar13);
            }
            this_local = (TParseContext *)0x0;
            goto LAB_00773b21;
          }
        }
      }
      iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
      pcVar12 = TType::getStorageQualifierString((TType *)CONCAT44(extraout_var_35,iVar2));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"non-matching or non-convertible constant type for const initializer",
                 pcVar12,"");
      iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
      pTVar9 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_36,iVar2) + 0x50))();
      TQualifier::makeTemporary(pTVar9);
      this_local = (TParseContext *)0x0;
    }
    else {
      iVar2 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      specializationCheck(this,loc,(TType *)CONCAT44(extraout_var_42,iVar2),"initializer");
      initNode = &TIntermediate::addSymbol
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             variable,loc)->super_TIntermTyped;
      local_210 = (TParseContext *)
                  TIntermediate::addAssign
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             EOpAssign,initNode,pTVar10,loc);
      this_01 = initNode;
      if (local_210 == (TParseContext *)0x0) {
        bVar14 = TIntermediate::getEnhancedMsgs
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate);
        TIntermTyped::getCompleteString_abi_cxx11_(&local_238,this_01,bVar14);
        bVar14 = TIntermediate::getEnhancedMsgs
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate);
        TIntermTyped::getCompleteString_abi_cxx11_(&local_260,pTVar10,bVar14);
        assignError(this,loc,"=",&local_238,&local_260);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_260);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_238);
      }
      this_local = local_210;
    }
  }
LAB_00773b21:
  local_dc = 1;
  TType::~TType((TType *)&d);
  return (TIntermNode *)this_local;
}

Assistant:

TIntermNode* TParseContext::executeInitializer(const TSourceLoc& loc, TIntermTyped* initializer, TVariable* variable)
{
    // A null initializer is an aggregate that hasn't had an op assigned yet
    // (still EOpNull, no relation to nullInit), and has no children.
    bool nullInit = initializer->getAsAggregate() && initializer->getAsAggregate()->getOp() == EOpNull &&
        initializer->getAsAggregate()->getSequence().size() == 0;

    //
    // Identifier must be of type constant, a global, or a temporary, and
    // starting at version 120, desktop allows uniforms to have initializers.
    //
    TStorageQualifier qualifier = variable->getType().getQualifier().storage;
    if (! (qualifier == EvqTemporary || qualifier == EvqGlobal || qualifier == EvqConst ||
           (qualifier == EvqUniform && !isEsProfile() && version >= 120))) {
        if (qualifier == EvqShared) {
            // GL_EXT_null_initializer allows this for shared, if it's a null initializer
            if (nullInit) {
                const char* feature = "initialization with shared qualifier";
                profileRequires(loc, EEsProfile, 0, E_GL_EXT_null_initializer, feature);
                profileRequires(loc, ~EEsProfile, 0, E_GL_EXT_null_initializer, feature);
            } else {
                error(loc, "initializer can only be a null initializer ('{}')", "shared", "");
            }
        } else {
            error(loc, " cannot initialize this type of qualifier ",
                  variable->getType().getStorageQualifierString(), "");
            return nullptr;
        }
    }

    if (nullInit) {
        // only some types can be null initialized
        if (variable->getType().containsUnsizedArray()) {
            error(loc, "null initializers can't size unsized arrays", "{}", "");
            return nullptr;
        }
        if (variable->getType().containsOpaque()) {
            error(loc, "null initializers can't be used on opaque values", "{}", "");
            return nullptr;
        }
        variable->getWritableType().getQualifier().setNullInit();
        return nullptr;
    }

    arrayObjectCheck(loc, variable->getType(), "array initializer");

    //
    // If the initializer was from braces { ... }, we convert the whole subtree to a
    // constructor-style subtree, allowing the rest of the code to operate
    // identically for both kinds of initializers.
    //
    // Type can't be deduced from the initializer list, so a skeletal type to
    // follow has to be passed in.  Constness and specialization-constness
    // should be deduced bottom up, not dictated by the skeletal type.
    //
    TType skeletalType;
    skeletalType.shallowCopy(variable->getType());
    skeletalType.getQualifier().makeTemporary();
    initializer = convertInitializerList(loc, skeletalType, initializer);
    if (! initializer) {
        // error recovery; don't leave const without constant values
        if (qualifier == EvqConst)
            variable->getWritableType().getQualifier().makeTemporary();
        return nullptr;
    }

    // Fix outer arrayness if variable is unsized, getting size from the initializer
    if (initializer->getType().isSizedArray() && variable->getType().isUnsizedArray())
        variable->getWritableType().changeOuterArraySize(initializer->getType().getOuterArraySize());

    // Inner arrayness can also get set by an initializer
    if (initializer->getType().isArrayOfArrays() && variable->getType().isArrayOfArrays() &&
        initializer->getType().getArraySizes()->getNumDims() ==
           variable->getType().getArraySizes()->getNumDims()) {
        // adopt unsized sizes from the initializer's sizes
        for (int d = 1; d < variable->getType().getArraySizes()->getNumDims(); ++d) {
            if (variable->getType().getArraySizes()->getDimSize(d) == UnsizedArraySize) {
                variable->getWritableType().getArraySizes()->setDimSize(d,
                    initializer->getType().getArraySizes()->getDimSize(d));
            }
        }
    }

    // Uniforms require a compile-time constant initializer
    if (qualifier == EvqUniform && ! initializer->getType().getQualifier().isFrontEndConstant()) {
        error(loc, "uniform initializers must be constant", "=", "'%s'",
              variable->getType().getCompleteString(intermediate.getEnhancedMsgs()).c_str());
        variable->getWritableType().getQualifier().makeTemporary();
        return nullptr;
    }
    // Global consts require a constant initializer (specialization constant is okay)
    if (qualifier == EvqConst && symbolTable.atGlobalLevel() && ! initializer->getType().getQualifier().isConstant()) {
        error(loc, "global const initializers must be constant", "=", "'%s'",
              variable->getType().getCompleteString(intermediate.getEnhancedMsgs()).c_str());
        variable->getWritableType().getQualifier().makeTemporary();
        return nullptr;
    }

    // Const variables require a constant initializer, depending on version
    if (qualifier == EvqConst) {
        if (! initializer->getType().getQualifier().isConstant()) {
            const char* initFeature = "non-constant initializer";
            requireProfile(loc, ~EEsProfile, initFeature);
            profileRequires(loc, ~EEsProfile, 420, E_GL_ARB_shading_language_420pack, initFeature);
            variable->getWritableType().getQualifier().storage = EvqConstReadOnly;
            qualifier = EvqConstReadOnly;
        }
    } else {
        // Non-const global variables in ES need a const initializer.
        //
        // "In declarations of global variables with no storage qualifier or with a const
        // qualifier any initializer must be a constant expression."
        if (symbolTable.atGlobalLevel() && ! initializer->getType().getQualifier().isConstant()) {
            const char* initFeature =
                "non-constant global initializer (needs GL_EXT_shader_non_constant_global_initializers)";
            if (isEsProfile()) {
                if (relaxedErrors() && ! extensionTurnedOn(E_GL_EXT_shader_non_constant_global_initializers))
                    warn(loc, "not allowed in this version", initFeature, "");
                else
                    profileRequires(loc, EEsProfile, 0, E_GL_EXT_shader_non_constant_global_initializers, initFeature);
            }
        }
    }

    if (qualifier == EvqConst || qualifier == EvqUniform) {
        // Compile-time tagging of the variable with its constant value...

        initializer = intermediate.addConversion(EOpAssign, variable->getType(), initializer);
        if (! initializer || ! initializer->getType().getQualifier().isConstant() ||
            variable->getType() != initializer->getType()) {
            error(loc, "non-matching or non-convertible constant type for const initializer",
                  variable->getType().getStorageQualifierString(), "");
            variable->getWritableType().getQualifier().makeTemporary();
            return nullptr;
        }

        // We either have a folded constant in getAsConstantUnion, or we have to use
        // the initializer's subtree in the AST to represent the computation of a
        // specialization constant.
        assert(initializer->getAsConstantUnion() || initializer->getType().getQualifier().isSpecConstant());
        if (initializer->getAsConstantUnion())
            variable->setConstArray(initializer->getAsConstantUnion()->getConstArray());
        else {
            // It's a specialization constant.
            variable->getWritableType().getQualifier().makeSpecConstant();

            // Keep the subtree that computes the specialization constant with the variable.
            // Later, a symbol node will adopt the subtree from the variable.
            variable->setConstSubtree(initializer);
        }
    } else {
        // normal assigning of a value to a variable...
        specializationCheck(loc, initializer->getType(), "initializer");
        TIntermSymbol* intermSymbol = intermediate.addSymbol(*variable, loc);
        TIntermTyped* initNode = intermediate.addAssign(EOpAssign, intermSymbol, initializer, loc);
        if (! initNode)
            assignError(loc, "=", intermSymbol->getCompleteString(intermediate.getEnhancedMsgs()), initializer->getCompleteString(intermediate.getEnhancedMsgs()));

        return initNode;
    }

    return nullptr;
}